

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int mg_get_cookie(char *cookie_header,char *var_name,char *dst,size_t dst_size)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  int local_50;
  int len;
  int name_len;
  char *end;
  char *p;
  char *s;
  size_t dst_size_local;
  char *dst_local;
  char *var_name_local;
  char *cookie_header_local;
  
  local_50 = -1;
  if ((dst == (char *)0x0) || (dst_size == 0)) {
    cookie_header_local._4_4_ = -2;
  }
  else {
    *dst = '\0';
    if ((var_name == (char *)0x0) || (cookie_header == (char *)0x0)) {
      cookie_header_local._4_4_ = -1;
    }
    else {
      sVar2 = strlen(var_name);
      iVar1 = (int)sVar2;
      sVar2 = strlen(cookie_header);
      p = cookie_header;
      while (pcVar3 = mg_strcasestr(p,var_name), pcVar3 != (char *)0x0) {
        if ((pcVar3[iVar1] == '=') && ((pcVar3 == cookie_header || (pcVar3[-1] == ' ')))) {
          p = pcVar3 + (iVar1 + 1);
          end = strchr(p,0x20);
          if (end == (char *)0x0) {
            end = cookie_header + sVar2;
          }
          if (end[-1] == ';') {
            end = end + -1;
          }
          if (((*p == '\"') && (end[-1] == '\"')) && (p + 1 < end)) {
            p = p + 1;
            end = end + -1;
          }
          if ((ulong)((long)end - (long)p) < dst_size) {
            local_50 = (int)end - (int)p;
            mg_strlcpy(dst,p,(long)local_50 + 1);
          }
          else {
            local_50 = -3;
          }
          break;
        }
        p = pcVar3 + iVar1;
      }
      cookie_header_local._4_4_ = local_50;
    }
  }
  return cookie_header_local._4_4_;
}

Assistant:

CIVETWEB_API int
mg_get_cookie(const char *cookie_header,
              const char *var_name,
              char *dst,
              size_t dst_size)
{
	const char *s, *p, *end;
	int name_len, len = -1;

	if ((dst == NULL) || (dst_size == 0)) {
		return -2;
	}

	dst[0] = '\0';
	if ((var_name == NULL) || ((s = cookie_header) == NULL)) {
		return -1;
	}

	name_len = (int)strlen(var_name);
	end = s + strlen(s);
	for (; (s = mg_strcasestr(s, var_name)) != NULL; s += name_len) {
		if (s[name_len] == '=') {
			/* HCP24: now check is it a substring or a full cookie name */
			if ((s == cookie_header) || (s[-1] == ' ')) {
				s += name_len + 1;
				if ((p = strchr(s, ' ')) == NULL) {
					p = end;
				}
				if (p[-1] == ';') {
					p--;
				}
				if ((*s == '"') && (p[-1] == '"') && (p > s + 1)) {
					s++;
					p--;
				}
				if ((size_t)(p - s) < dst_size) {
					len = (int)(p - s);
					mg_strlcpy(dst, s, (size_t)len + 1);
				} else {
					len = -3;
				}
				break;
			}
		}
	}
	return len;
}